

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O0

void __thiscall
glcts::MultisampleTextureDependenciesTexParameterTest::checkAllTexParameterInvocations
          (MultisampleTextureDependenciesTexParameterTest *this,GLenum expected_error_code,
          GLint value,GLenum pname,GLenum texture_target)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  TestError *pTVar5;
  MessageBuilder local_648;
  MessageBuilder local_4c8;
  MessageBuilder local_348;
  MessageBuilder local_1b8;
  GLenum local_34;
  float local_30;
  GLint int_value;
  GLfloat float_value;
  GLenum error_code;
  Functions *gl;
  GLenum texture_target_local;
  GLenum pname_local;
  GLint value_local;
  GLenum expected_error_code_local;
  MultisampleTextureDependenciesTexParameterTest *this_local;
  
  gl._0_4_ = texture_target;
  gl._4_4_ = pname;
  texture_target_local = value;
  pname_local = expected_error_code;
  _value_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _float_value = CONCAT44(extraout_var,iVar1);
  int_value = 0;
  local_30 = (float)(int)texture_target_local;
  local_34 = texture_target_local;
  (**(code **)(_float_value + 0x1350))(local_30,(GLenum)gl,gl._4_4_);
  int_value = (**(code **)(_float_value + 0x800))();
  if (int_value != pname_local) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1b8,(char (*) [43])"glTexParameterf() call generated an error ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)&int_value);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [37])" instead of the expected error code ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&pname_local);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"glTexParameterf() call generated an unexpected error.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
               ,0x8d5);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_float_value + 0x1360))((GLenum)gl,gl._4_4_,local_34);
  int_value = (**(code **)(_float_value + 0x800))();
  if (int_value != pname_local) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_348,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_348,(char (*) [43])"glTexParameteri() call generated an error ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)&int_value);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [37])" instead of the expected error code ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&pname_local);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"glTexParameterf() call generated an unexpected error.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
               ,0x8e2);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_float_value + 0x1358))((GLenum)gl,gl._4_4_,&local_30);
  int_value = (**(code **)(_float_value + 0x800))();
  if (int_value != pname_local) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4c8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_4c8,(char (*) [44])"glTexParameterfv() call generated an error ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)&int_value);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [37])" instead of the expected error code ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&pname_local);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4c8);
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"glTexParameterfv() call generated an unexpected error.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
               ,0x8ef);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_float_value + 0x1368))((GLenum)gl,gl._4_4_,&local_34);
  int_value = (**(code **)(_float_value + 0x800))();
  if (int_value != pname_local) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_648,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_648,(char (*) [44])"glTexParameteriv() call generated an error ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)&int_value);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [37])" instead of the expected error code ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&pname_local);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_648);
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"glTexParameteriv() call generated an unexpected error.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
               ,0x8fc);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void MultisampleTextureDependenciesTexParameterTest::checkAllTexParameterInvocations(glw::GLenum expected_error_code,
																					 glw::GLint  value,
																					 glw::GLenum pname,
																					 glw::GLenum texture_target)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLenum		   error_code  = GL_NO_ERROR;
	const glw::GLfloat float_value = (glw::GLfloat)value;
	const glw::GLint   int_value   = value;

	/* glTexParameterf() */
	gl.texParameterf(texture_target, pname, float_value);

	error_code = gl.getError();

	if (error_code != expected_error_code)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glTexParameterf() call generated an error " << error_code
						   << " instead of the expected error code " << expected_error_code << tcu::TestLog::EndMessage;

		TCU_FAIL("glTexParameterf() call generated an unexpected error.");
	}

	/* glTexParameteri() */
	gl.texParameteri(texture_target, pname, int_value);

	error_code = gl.getError();

	if (error_code != expected_error_code)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glTexParameteri() call generated an error " << error_code
						   << " instead of the expected error code " << expected_error_code << tcu::TestLog::EndMessage;

		TCU_FAIL("glTexParameterf() call generated an unexpected error.");
	}

	/* glTexParameterfv() */
	gl.texParameterfv(texture_target, pname, &float_value);

	error_code = gl.getError();

	if (error_code != expected_error_code)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glTexParameterfv() call generated an error " << error_code
						   << " instead of the expected error code " << expected_error_code << tcu::TestLog::EndMessage;

		TCU_FAIL("glTexParameterfv() call generated an unexpected error.");
	}

	/* glTexParameteriv() */
	gl.texParameteriv(texture_target, pname, &int_value);

	error_code = gl.getError();

	if (error_code != expected_error_code)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glTexParameteriv() call generated an error " << error_code
						   << " instead of the expected error code " << expected_error_code << tcu::TestLog::EndMessage;

		TCU_FAIL("glTexParameteriv() call generated an unexpected error.");
	}
}